

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict param_type_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  node_t_conflict pnVar3;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict op5;
  char *expected_name;
  pos_t p;
  undefined1 local_68 [8];
  pos_t pos;
  node_t_conflict pnStack_50;
  int comma_p;
  node_t_conflict r;
  node_t_conflict op2;
  node_t_conflict op1;
  node_t_conflict attrs;
  node_t_conflict list;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  c2m_ctx_local = (c2m_ctx_t)new_node(c2m_ctx,N_LIST);
  if ((short)*(undefined4 *)ppVar1->curr_token != 0x29) {
    do {
      pnVar3 = declaration_specs(c2m_ctx,no_err_p,(node_t_conflict)0x0);
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
      if (((short)*(undefined4 *)ppVar1->curr_token == 0x2c) ||
         ((short)*(undefined4 *)ppVar1->curr_token == 0x29)) {
        pnVar4 = new_node(c2m_ctx,N_IGNORE);
        pnVar5 = new_node(c2m_ctx,N_LIST);
        pnVar4 = new_node2(c2m_ctx,N_DECL,pnVar4,pnVar5);
        pnStack_50 = new_node2(c2m_ctx,N_TYPE,pnVar3,pnVar4);
      }
      else {
        pnVar4 = try_f(c2m_ctx,param_type_abstract_declarator);
        if (pnVar4 == &err_struct) {
          pnVar4 = declarator(c2m_ctx,no_err_p);
          if (pnVar4 == &err_struct) {
            return &err_struct;
          }
          op1 = try_attr_spec(c2m_ctx,ppVar1->curr_token->pos,(node_t_conflict *)0x0);
          if (op1 == &err_struct) {
            op1 = new_node(c2m_ctx,N_IGNORE);
          }
          p = get_node_pos(c2m_ctx,&err_struct);
          pnVar5 = new_node(c2m_ctx,N_IGNORE);
          op5 = new_node(c2m_ctx,N_IGNORE);
          pnStack_50 = new_pos_node5(c2m_ctx,N_SPEC_DECL,p,pnVar3,pnVar4,op1,pnVar5,op5);
        }
        else {
          pnStack_50 = new_node2(c2m_ctx,N_TYPE,pnVar3,pnVar4);
        }
      }
      op_append(c2m_ctx,(node_t_conflict)c2m_ctx_local,pnStack_50);
      pos.ln_pos = 0;
      iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    } while ((iVar2 != 0) && (pos.ln_pos = 1, (short)*(undefined4 *)ppVar1->curr_token != 0x10f));
    if (pos.ln_pos != 0) {
      iVar2 = match(c2m_ctx,0x10f,(pos_t *)local_68,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        if (ppVar1->record_level == 0) {
          expected_name = get_token_name(c2m_ctx,0x10f);
          syntax_error(c2m_ctx,expected_name);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
      }
      else {
        pnVar3 = new_pos_node(c2m_ctx,N_DOTS,_local_68);
        op_append(c2m_ctx,(node_t_conflict)c2m_ctx_local,pnVar3);
      }
    }
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (param_type_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, attrs, op1, op2, r = err_node;
  int comma_p;
  pos_t pos;

  list = new_node (c2m_ctx, N_LIST);
  if (C (')')) return list;
  for (;;) { /* parameter-list, parameter-declaration */
    PA (declaration_specs, NULL);
    op1 = r;
    if (C (',') || C (')')) {
      r = new_node2 (c2m_ctx, N_TYPE, op1,
                     new_node2 (c2m_ctx, N_DECL, new_node (c2m_ctx, N_IGNORE),
                                new_node (c2m_ctx, N_LIST)));
    } else if ((op2 = TRY (param_type_abstract_declarator)) != err_node) {
      /* Try param_type_abstract_declarator first for possible func
         type case ("<res_type> (<typedef_name>)") which can conflict with declarator ("<res_type>
         (<new decl identifier>)")  */
      r = new_node2 (c2m_ctx, N_TYPE, op1, op2);
    } else {
      P (declarator);
      attrs = try_attr_spec (c2m_ctx, curr_token->pos, NULL);
      if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
      r = new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (op2), op1, r, attrs,
                         new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE));
    }
    op_append (c2m_ctx, list, r);
    comma_p = FALSE;
    if (!M (',')) break;
    comma_p = TRUE;
    if (C (T_DOTS)) break;
  }
  if (comma_p) {
    PTP (T_DOTS, pos);
    op_append (c2m_ctx, list, new_pos_node (c2m_ctx, N_DOTS, pos));
  }
  return list;
}